

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManTransformDualOutput(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  Gia_Man_t *p_00;
  size_t sVar10;
  char *pcVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  Gia_Man_t *pGVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  Vec_Int_t *__ptr;
  
  pVVar8 = Gia_ManCollectOneSide(p,0);
  pVVar9 = Gia_ManCollectOneSide(p,1);
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xc05,"Gia_Man_t *Gia_ManTransformDualOutput(Gia_Man_t *)");
  }
  if ((p->vCos->nSize & 1) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xc06,"Gia_Man_t *Gia_ManTransformDualOutput(Gia_Man_t *)");
  }
  iVar2 = pVVar8->nSize;
  iVar1 = pVVar9->nSize;
  __ptr = pVVar8;
  if (iVar1 < iVar2) {
    __ptr = pVVar9;
    pVVar9 = pVVar8;
  }
  if (pVVar9->nSize < __ptr->nSize) {
    __assert_fail("Vec_IntSize(vNodes0) <= Vec_IntSize(vNodes1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xc0c,"Gia_Man_t *Gia_ManTransformDualOutput(Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar4);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar4);
  }
  p_00->pName = pcVar11;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar4);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar4);
  }
  p_00->pSpec = pcVar11;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar17 = 0;
    do {
      iVar3 = pVVar8->pArray[lVar17];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_001ec03f;
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_00->pObjs;
      if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) {
LAB_001ec07d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) goto LAB_001ec07d;
      pGVar5[iVar3].Value = (int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar8 = p->vCis;
    } while (lVar17 < pVVar8->nSize);
  }
  if (0 < __ptr->nSize) {
    lVar17 = 0;
    do {
      iVar3 = __ptr->pArray[lVar17];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_001ec03f;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar3;
      uVar13 = *(ulong *)pGVar5;
      if ((int)pGVar5[-(ulong)((uint)uVar13 & 0x1fffffff)].Value < 0) goto LAB_001ec05e;
      uVar7 = (uint)(uVar13 >> 0x20);
      if ((int)pGVar5[-(ulong)(uVar7 & 0x1fffffff)].Value < 0) goto LAB_001ec05e;
      uVar7 = Gia_ManHashAnd(p_00,(uint)(uVar13 >> 0x1d) & 1 ^
                                  pGVar5[-(ulong)((uint)uVar13 & 0x1fffffff)].Value,
                             pGVar5[-(ulong)(uVar7 & 0x1fffffff)].Value ^ uVar7 >> 0x1d & 1);
      pGVar5->Value = uVar7;
      lVar17 = lVar17 + 1;
    } while (lVar17 < __ptr->nSize);
  }
  if (0 < pVVar9->nSize) {
    lVar17 = 0;
    do {
      iVar3 = pVVar9->pArray[lVar17];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_001ec03f;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar3;
      uVar13 = *(ulong *)pGVar5;
      if ((int)pGVar5[-(ulong)((uint)uVar13 & 0x1fffffff)].Value < 0) goto LAB_001ec05e;
      uVar7 = (uint)(uVar13 >> 0x20);
      if ((int)pGVar5[-(ulong)(uVar7 & 0x1fffffff)].Value < 0) goto LAB_001ec05e;
      uVar7 = Gia_ManHashAnd(p_00,(uint)(uVar13 >> 0x1d) & 1 ^
                                  pGVar5[-(ulong)((uint)uVar13 & 0x1fffffff)].Value,
                             pGVar5[-(ulong)(uVar7 & 0x1fffffff)].Value ^ uVar7 >> 0x1d & 1);
      pGVar5->Value = uVar7;
      lVar17 = lVar17 + 1;
    } while (lVar17 < pVVar9->nSize);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (pVVar9->pArray != (int *)0x0) {
    free(pVVar9->pArray);
  }
  free(pVVar9);
  pVVar9 = p->vCos;
  uVar7 = pVVar9->nSize;
  uVar13 = (ulong)uVar7;
  uVar15 = uVar7 - p->nRegs;
  uVar16 = (ulong)uVar15;
  if (uVar15 != 0 && p->nRegs <= (int)uVar7) {
    lVar17 = 0;
LAB_001ebf41:
    if ((int)uVar13 <= lVar17) {
LAB_001ec09c:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar3 = pVVar9->pArray[lVar17];
    if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_001ec03f:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar5 = p->pObjs;
    if (pGVar5 != (Gia_Obj_t *)0x0) {
      uVar7 = (uint)lVar17 ^ (uint)(iVar1 < iVar2);
      if ((int)uVar16 <= (int)uVar7) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if ((int)uVar13 <= (int)uVar7) goto LAB_001ec09c;
      uVar7 = pVVar9->pArray[uVar7];
      if (((long)(int)uVar7 < 0) || ((uint)p->nObjs <= uVar7)) goto LAB_001ec03f;
      uVar15 = (uint)*(undefined8 *)(pGVar5 + (int)uVar7);
      uVar7 = (pGVar5 + (int)uVar7)[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar7 < 0) {
LAB_001ec05e:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar7 = Gia_ManAppendCo(p_00,uVar15 >> 0x1d & 1 ^ uVar7);
      pGVar5[iVar3].Value = uVar7;
      lVar17 = lVar17 + 1;
      pVVar9 = p->vCos;
      uVar13 = (ulong)pVVar9->nSize;
      uVar16 = uVar13 - (long)p->nRegs;
      if (lVar17 < (long)uVar16) goto LAB_001ebf41;
    }
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar14 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar14;
}

Assistant:

Gia_Man_t * Gia_ManTransformDualOutput( Gia_Man_t * p )
{
    Vec_Int_t * vNodes0 = Gia_ManCollectOneSide( p, 0 );
    Vec_Int_t * vNodes1 = Gia_ManCollectOneSide( p, 1 );
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObj2;
    int i, fSwap = 0;
    assert( Gia_ManRegNum(p) == 0 );
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    if ( Vec_IntSize(vNodes0) > Vec_IntSize(vNodes1) )
    {
        ABC_SWAP( Vec_Int_t *, vNodes0, vNodes1 );
        fSwap = 1;
    }
    assert( Vec_IntSize(vNodes0) <= Vec_IntSize(vNodes1) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachObjVec( vNodes0, p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachObjVec( vNodes1, p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Vec_IntFree( vNodes0 );
    Vec_IntFree( vNodes1 );
    Gia_ManForEachPo( p, pObj, i )
    {
        pObj2 = Gia_ManPo( p, i^fSwap );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj2) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}